

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

bool xercesc_4_0::XMLString::isInList(XMLCh *toFind,XMLCh *enumList)

{
  short *psVar1;
  XMLCh XVar2;
  bool bVar3;
  byte in_AL;
  long lVar4;
  long lVar5;
  long lVar6;
  XMLCh *listPtr;
  
  lVar4 = 0;
  if (toFind != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toFind + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  do {
    if (*enumList == L'\0') {
      in_AL = 0;
      break;
    }
    lVar5 = 0;
    lVar6 = lVar5;
    if (lVar4 != 0) {
      do {
        lVar6 = lVar5;
        if (enumList[lVar5] != toFind[lVar5]) break;
        lVar5 = lVar5 + 1;
        lVar6 = lVar4;
      } while (lVar4 != lVar5);
    }
    if ((lVar6 == lVar4) && ((enumList[lVar6] & 0xffdfU) == 0)) {
      in_AL = 1;
LAB_00258c9d:
      bVar3 = false;
    }
    else {
      do {
        XVar2 = *enumList;
        if (XVar2 == L'\0') {
          in_AL = 0;
          goto LAB_00258c9d;
        }
        enumList = enumList + 1;
      } while (XVar2 != L' ');
      bVar3 = true;
    }
  } while (bVar3);
  return (bool)(in_AL & 1);
}

Assistant:

bool XMLString::isInList(const XMLCh* const toFind, const XMLCh* const enumList)
{
    //
    //  We loop through the values in the list via this outer loop. We end
    //  when we hit the end of the enum list or get a match.
    //
    const XMLCh* listPtr = enumList;
    const XMLSize_t findLen = XMLString::stringLen(toFind);
    while (*listPtr)
    {
        XMLSize_t testInd;
        for (testInd = 0; testInd < findLen; testInd++)
        {
            //
            //  If they don't match, then reset and try again. Note that
            //  hitting the end of the current item will cause a mismatch
            //  because there can be no spaces in the toFind string.
            //
            if (listPtr[testInd] != toFind[testInd])
                break;
        }

        //
        //  If we went the distance, see if we matched. If we did, the current
        //  list character has to be null or space.
        //
        if (testInd == findLen)
        {
            if ((listPtr[testInd] == chSpace) || !listPtr[testInd])
                return true;
        }

        // Run the list pointer up to the next substring
        while ((*listPtr != chSpace) && *listPtr)
            listPtr++;

        // If we hit the end, then we failed
        if (!*listPtr)
            return false;

        // Else move past the space and try again
        listPtr++;
    }

    // We never found it
    return false;
}